

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucm.cpp
# Opt level: O1

void ucm_addMapping(UCMTable *table,UCMapping *m,UChar32 *codePoints,uint8_t *bytes)

{
  char cVar1;
  uint32_t uVar2;
  int8_t iVar3;
  int8_t iVar4;
  int8_t iVar5;
  anon_union_4_2_095b93d3_for_b aVar6;
  int iVar7;
  int32_t iVar8;
  UCMapping *pUVar9;
  UChar32 *pUVar10;
  uint8_t *puVar11;
  long lVar12;
  byte bVar13;
  int iVar14;
  UCMStates *states;
  anon_union_4_2_095b93d3_for_b *bytes_00;
  UCMTable *table_00;
  anon_union_4_2_095b93d3_for_b *paVar15;
  UCMapping *pUVar16;
  
  iVar7 = table->mappingsCapacity;
  states = (UCMStates *)m;
  if (table->mappingsLength < iVar7) {
LAB_001df565:
    if ((m->uLen < '\x02') || (table->codePointsCapacity != 0)) {
LAB_001df590:
      if (('\x04' < m->bLen) && (table->bytesCapacity == 0)) {
        table->bytesCapacity = 10000;
        puVar11 = (uint8_t *)uprv_malloc_63(10000);
        table->bytes = puVar11;
        if (puVar11 == (uint8_t *)0x0) goto LAB_001df6bd;
      }
      bVar13 = m->uLen;
      if (1 < (char)bVar13) {
        iVar7 = table->codePointsLength;
        iVar14 = iVar7 + (char)bVar13;
        table->codePointsLength = iVar14;
        if (table->codePointsCapacity < iVar14) goto LAB_001df6a7;
        states = (UCMStates *)codePoints;
        memcpy(table->codePoints + iVar7,codePoints,(ulong)bVar13 << 2);
        m->u = iVar7;
      }
      iVar7 = (int)m->bLen;
      if (iVar7 < 5) {
LAB_001df62c:
        cVar1 = m->uLen;
        if (0 < (long)cVar1) {
          lVar12 = 0;
          do {
            bVar13 = 1;
            if ((0xffff < codePoints[lVar12]) ||
               (bVar13 = 2, (codePoints[lVar12] & 0xfffff800U) == 0xd800)) {
              table->unicodeMask = table->unicodeMask | bVar13;
            }
            lVar12 = lVar12 + 1;
          } while (cVar1 != lVar12);
        }
        table->flagsType = table->flagsType | 1U - (m->f >> 7);
        pUVar9 = table->mappings;
        iVar7 = table->mappingsLength;
        table->mappingsLength = iVar7 + 1;
        iVar3 = m->bLen;
        iVar4 = m->f;
        iVar5 = m->moveFlag;
        pUVar16 = pUVar9 + iVar7;
        pUVar16->uLen = m->uLen;
        pUVar16->bLen = iVar3;
        pUVar16->f = iVar4;
        pUVar16->moveFlag = iVar5;
        aVar6 = m->b;
        pUVar9 = pUVar9 + iVar7;
        pUVar9->u = m->u;
        pUVar9->b = aVar6;
        table->isSorted = '\0';
        return;
      }
      uVar2 = table->bytesLength;
      table->bytesLength = uVar2 + iVar7;
      if ((int)(uVar2 + iVar7) <= table->bytesCapacity) {
        memcpy(table->bytes + (int)uVar2,bytes,(long)iVar7);
        (m->b).idx = uVar2;
        goto LAB_001df62c;
      }
      goto LAB_001df6ac;
    }
    table->codePointsCapacity = 10000;
    pUVar10 = (UChar32 *)uprv_malloc_63(40000);
    table->codePoints = pUVar10;
    if (pUVar10 != (UChar32 *)0x0) goto LAB_001df590;
  }
  else {
    iVar14 = 1000;
    if (iVar7 != 0) {
      iVar14 = iVar7 * 10;
    }
    table->mappingsCapacity = iVar14;
    states = (UCMStates *)((long)iVar14 * 0xc);
    pUVar9 = (UCMapping *)uprv_realloc_63(table->mappings,(size_t)states);
    table->mappings = pUVar9;
    if (pUVar9 != (UCMapping *)0x0) {
      if (table->reverseMap != (int32_t *)0x0) {
        uprv_free_63(table->reverseMap);
        table->reverseMap = (int32_t *)0x0;
      }
      goto LAB_001df565;
    }
    table = (UCMTable *)&table->mappingsCapacity;
    ucm_addMapping_cold_1();
LAB_001df6a7:
    ucm_addMapping_cold_3();
LAB_001df6ac:
    ucm_addMapping_cold_2();
  }
  table = (UCMTable *)&table->codePointsCapacity;
  ucm_addMapping_cold_5();
LAB_001df6bd:
  table_00 = (UCMTable *)&table->bytesCapacity;
  ucm_addMapping_cold_4();
  iVar7 = table_00->mappingsLength;
  if (0 < (long)iVar7) {
    pUVar9 = table_00->mappings;
    paVar15 = &pUVar9->b;
    do {
      bytes_00 = paVar15;
      if (4 < *(int8_t *)((long)paVar15 + 5)) {
        bytes_00 = (anon_union_4_2_095b93d3_for_b *)(table_00->bytes + paVar15->idx);
      }
      iVar8 = ucm_countChars(states,bytes_00->bytes,(int)*(int8_t *)((long)paVar15 + 5));
      if (iVar8 < 1) {
        ucm_printMapping(table_00,(UCMapping *)(paVar15 + -1),_stderr);
      }
      pUVar16 = (UCMapping *)(paVar15 + 2);
      paVar15 = paVar15 + 3;
    } while (pUVar16 < pUVar9 + iVar7);
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ucm_addMapping(UCMTable *table,
               UCMapping *m,
               UChar32 codePoints[UCNV_EXT_MAX_UCHARS],
               uint8_t bytes[UCNV_EXT_MAX_BYTES]) {
    UCMapping *tm;
    UChar32 c;
    int32_t idx;

    if(table->mappingsLength>=table->mappingsCapacity) {
        /* make the mappings array larger */
        if(table->mappingsCapacity==0) {
            table->mappingsCapacity=1000;
        } else {
            table->mappingsCapacity*=10;
        }
        table->mappings=(UCMapping *)uprv_realloc(table->mappings,
                                             table->mappingsCapacity*sizeof(UCMapping));
        if(table->mappings==NULL) {
            fprintf(stderr, "ucm error: unable to allocate %d UCMappings\n",
                            (int)table->mappingsCapacity);
            exit(U_MEMORY_ALLOCATION_ERROR);
        }

        if(table->reverseMap!=NULL) {
            /* the reverseMap must be reallocated in a new sort */
            uprv_free(table->reverseMap);
            table->reverseMap=NULL;
        }
    }

    if(m->uLen>1 && table->codePointsCapacity==0) {
        table->codePointsCapacity=10000;
        table->codePoints=(UChar32 *)uprv_malloc(table->codePointsCapacity*4);
        if(table->codePoints==NULL) {
            fprintf(stderr, "ucm error: unable to allocate %d UChar32s\n",
                            (int)table->codePointsCapacity);
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
    }

    if(m->bLen>4 && table->bytesCapacity==0) {
        table->bytesCapacity=10000;
        table->bytes=(uint8_t *)uprv_malloc(table->bytesCapacity);
        if(table->bytes==NULL) {
            fprintf(stderr, "ucm error: unable to allocate %d bytes\n",
                            (int)table->bytesCapacity);
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
    }

    if(m->uLen>1) {
        idx=table->codePointsLength;
        table->codePointsLength+=m->uLen;
        if(table->codePointsLength>table->codePointsCapacity) {
            fprintf(stderr, "ucm error: too many code points in multiple-code point mappings\n");
            exit(U_MEMORY_ALLOCATION_ERROR);
        }

        uprv_memcpy(table->codePoints+idx, codePoints, (size_t)m->uLen*4);
        m->u=idx;
    }

    if(m->bLen>4) {
        idx=table->bytesLength;
        table->bytesLength+=m->bLen;
        if(table->bytesLength>table->bytesCapacity) {
            fprintf(stderr, "ucm error: too many bytes in mappings with >4 charset bytes\n");
            exit(U_MEMORY_ALLOCATION_ERROR);
        }

        uprv_memcpy(table->bytes+idx, bytes, m->bLen);
        m->b.idx=idx;
    }

    /* set unicodeMask */
    for(idx=0; idx<m->uLen; ++idx) {
        c=codePoints[idx];
        if(c>=0x10000) {
            table->unicodeMask|=UCNV_HAS_SUPPLEMENTARY; /* there are supplementary code points */
        } else if(U_IS_SURROGATE(c)) {
            table->unicodeMask|=UCNV_HAS_SURROGATES;    /* there are surrogate code points */
        }
    }

    /* set flagsType */
    if(m->f<0) {
        table->flagsType|=UCM_FLAGS_IMPLICIT;
    } else {
        table->flagsType|=UCM_FLAGS_EXPLICIT;
    }

    tm=table->mappings+table->mappingsLength++;
    uprv_memcpy(tm, m, sizeof(UCMapping));

    table->isSorted=FALSE;
}